

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall
cmCPackIFWResourcesParser::cmCPackIFWResourcesParser
          (cmCPackIFWResourcesParser *this,cmCPackIFWInstaller *i)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser =
       (_func_int **)&PTR__cmCPackIFWResourcesParser_005db4e0;
  this->installer = i;
  this->file = false;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->basePath)._M_dataplus._M_p = (pointer)&(this->basePath).field_2;
  (this->basePath)._M_string_length = 0;
  (this->basePath).field_2._M_local_buf[0] = '\0';
  std::operator+(&local_40,&i->Directory,"/resources");
  std::__cxx11::string::operator=((string *)&this->path,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

cmCPackIFWResourcesParser(cmCPackIFWInstaller* i)
    : installer(i)
    , file(false)
  {
    this->path = i->Directory + "/resources";
  }